

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O1

void LoadFunction(LoadState *S,Proto *f,TString *psource)

{
  int iVar1;
  uint uVar2;
  ulong in_RAX;
  TString *pTVar3;
  Instruction *b;
  TValue *pTVar4;
  Upvaldesc *pUVar5;
  Proto **ppPVar6;
  long lVar7;
  Proto *pPVar8;
  int *b_00;
  LocVar *pLVar9;
  size_t sVar10;
  long lVar11;
  size_t sVar12;
  int x;
  ulong local_38;
  
  local_38 = in_RAX;
  pTVar3 = LoadString(S);
  if (pTVar3 != (TString *)0x0) {
    psource = pTVar3;
  }
  f->source = psource;
  LoadBlock(S,&local_38,4);
  f->linedefined = (int)local_38;
  LoadBlock(S,&local_38,4);
  f->lastlinedefined = (int)local_38;
  LoadBlock(S,&local_38,1);
  f->numparams = (byte)local_38;
  LoadBlock(S,&local_38,1);
  f->is_vararg = (byte)local_38;
  LoadBlock(S,&local_38,1);
  f->maxstacksize = (byte)local_38;
  LoadBlock(S,&local_38,4);
  iVar1 = (int)local_38;
  lVar11 = (long)(int)local_38;
  b = (Instruction *)luaM_realloc_(S->L,(void *)0x0,0,lVar11 << 2);
  f->code = b;
  f->sizecode = iVar1;
  LoadBlock(S,b,lVar11 << 2);
  LoadBlock(S,&local_38,4);
  iVar1 = (int)local_38;
  lVar11 = (long)(int)local_38;
  sVar12 = lVar11 << 4;
  pTVar4 = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,sVar12);
  f->k = pTVar4;
  f->sizek = iVar1;
  if (0 < lVar11) {
    sVar10 = 0;
    do {
      *(undefined4 *)((long)&pTVar4->tt_ + sVar10) = 0;
      sVar10 = sVar10 + 0x10;
    } while (sVar12 != sVar10);
    if (0 < iVar1) {
      sVar10 = 0;
      do {
        pTVar4 = f->k;
        LoadBlock(S,&local_38,1);
        uVar2 = (uint)(byte)local_38;
        switch(local_38 & 0xff) {
        case 0:
          break;
        case 1:
          LoadBlock(S,&local_38,1);
          *(uint *)((long)&pTVar4->value_ + sVar10) = (uint)(byte)local_38;
          uVar2 = 1;
          break;
        case 2:
          goto switchD_0011a9fe_caseD_2;
        case 3:
          LoadBlock(S,&local_38,8);
          *(ulong *)((long)&pTVar4->value_ + sVar10) = local_38;
          uVar2 = 3;
          break;
        case 4:
switchD_0011a9fe_caseD_4:
          pTVar3 = LoadString(S);
          *(TString **)((long)&pTVar4->value_ + sVar10) = pTVar3;
          uVar2 = pTVar3->tt | 0x40;
          break;
        default:
          if ((byte)local_38 == 0x13) {
            LoadBlock(S,&local_38,8);
            *(ulong *)((long)&pTVar4->value_ + sVar10) = local_38;
            uVar2 = 0x13;
            break;
          }
          if ((byte)local_38 == 0x14) goto switchD_0011a9fe_caseD_4;
          goto switchD_0011a9fe_caseD_2;
        }
        *(uint *)((long)&pTVar4->tt_ + sVar10) = uVar2;
switchD_0011a9fe_caseD_2:
        sVar10 = sVar10 + 0x10;
      } while (sVar12 != sVar10);
    }
  }
  LoadBlock(S,&local_38,4);
  iVar1 = (int)local_38;
  lVar11 = (long)(int)local_38;
  sVar12 = lVar11 << 4;
  pUVar5 = (Upvaldesc *)luaM_realloc_(S->L,(void *)0x0,0,sVar12);
  f->upvalues = pUVar5;
  f->sizeupvalues = iVar1;
  if (0 < lVar11) {
    sVar10 = 0;
    do {
      *(undefined8 *)((long)&pUVar5->name + sVar10) = 0;
      sVar10 = sVar10 + 0x10;
    } while (sVar12 != sVar10);
    if (0 < iVar1) {
      sVar10 = 0;
      do {
        LoadBlock(S,&local_38,1);
        (&f->upvalues->instack)[sVar10] = (byte)local_38;
        LoadBlock(S,&local_38,1);
        (&f->upvalues->idx)[sVar10] = (byte)local_38;
        sVar10 = sVar10 + 0x10;
      } while (sVar12 != sVar10);
    }
  }
  LoadBlock(S,&local_38,4);
  iVar1 = (int)local_38;
  lVar11 = (long)(int)local_38;
  ppPVar6 = (Proto **)luaM_realloc_(S->L,(void *)0x0,0,lVar11 * 8);
  f->p = ppPVar6;
  f->sizep = iVar1;
  if (0 < lVar11) {
    lVar7 = 0;
    do {
      f->p[lVar7] = (Proto *)0x0;
      lVar7 = lVar7 + 1;
    } while (lVar11 != lVar7);
  }
  if (0 < iVar1) {
    lVar7 = 0;
    do {
      pPVar8 = luaF_newproto(S->L);
      f->p[lVar7] = pPVar8;
      LoadFunction(S,f->p[lVar7],f->source);
      lVar7 = lVar7 + 1;
    } while (lVar11 != lVar7);
  }
  LoadBlock(S,&local_38,4);
  iVar1 = (int)local_38;
  lVar11 = (long)(int)local_38;
  b_00 = (int *)luaM_realloc_(S->L,(void *)0x0,0,lVar11 << 2);
  f->lineinfo = b_00;
  f->sizelineinfo = iVar1;
  LoadBlock(S,b_00,lVar11 << 2);
  LoadBlock(S,&local_38,4);
  iVar1 = (int)local_38;
  lVar11 = (long)(int)local_38;
  sVar12 = lVar11 << 4;
  pLVar9 = (LocVar *)luaM_realloc_(S->L,(void *)0x0,0,sVar12);
  f->locvars = pLVar9;
  f->sizelocvars = iVar1;
  if (0 < lVar11) {
    sVar10 = 0;
    do {
      *(undefined8 *)((long)&pLVar9->varname + sVar10) = 0;
      sVar10 = sVar10 + 0x10;
    } while (sVar12 != sVar10);
    if (0 < iVar1) {
      sVar10 = 0;
      do {
        pTVar3 = LoadString(S);
        *(TString **)((long)&f->locvars->varname + sVar10) = pTVar3;
        LoadBlock(S,&local_38,4);
        *(int *)((long)&f->locvars->startpc + sVar10) = (int)local_38;
        LoadBlock(S,&local_38,4);
        *(int *)((long)&f->locvars->endpc + sVar10) = (int)local_38;
        sVar10 = sVar10 + 0x10;
      } while (sVar12 != sVar10);
    }
  }
  LoadBlock(S,&local_38,4);
  if (0 < (long)(int)local_38) {
    lVar11 = 0;
    do {
      pTVar3 = LoadString(S);
      *(TString **)((long)&f->upvalues->name + lVar11) = pTVar3;
      lVar11 = lVar11 + 0x10;
    } while ((long)(int)local_38 * 0x10 != lVar11);
  }
  return;
}

Assistant:

static void LoadFunction(LoadState *S, Proto *f, TString *psource) {
    f->source = LoadString(S);
    if (f->source == NULL)  /* no source in dump? */
        f->source = psource;  /* reuse parent's source */
    f->linedefined = LoadInt(S);
    f->lastlinedefined = LoadInt(S);
    f->numparams = LoadByte(S);
    f->is_vararg = LoadByte(S);
    f->maxstacksize = LoadByte(S);
    LoadCode(S, f);
    LoadConstants(S, f);
    LoadUpvalues(S, f);
    LoadProtos(S, f);
    LoadDebug(S, f);
}